

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O1

void __thiscall
pbrt::BVHLightSampler::BVHLightSampler
          (BVHLightSampler *this,span<const_pbrt::LightHandle> lights,Allocator alloc)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  size_t sVar7;
  LightHandle *first;
  size_t sVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  vector<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
  bvhLights;
  LightHandle light;
  optional<pbrt::LightBounds> lightBounds;
  pair<int,_pbrt::LightBounds> local_68;
  
  sVar7 = lights.n;
  first = lights.ptr;
  lightBounds.optionalValue._0_8_ = alloc.memoryResource;
  pstd::vector<pbrt::LightHandle,pstd::pmr::polymorphic_allocator<pbrt::LightHandle>>::
  vector<pbrt::LightHandle_const*>
            ((vector<pbrt::LightHandle,pstd::pmr::polymorphic_allocator<pbrt::LightHandle>> *)this,
             first,first + sVar7,(polymorphic_allocator<pbrt::LightHandle> *)&lightBounds);
  (this->infiniteLights).alloc.memoryResource = alloc.memoryResource;
  (this->infiniteLights).ptr = (LightHandle *)0x0;
  (this->infiniteLights).nAlloc = 0;
  (this->infiniteLights).nStored = 0;
  (this->allLightBounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  (this->allLightBounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  (this->infiniteLights).nStored = 0;
  (this->allLightBounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  (this->allLightBounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  *(undefined8 *)&(this->allLightBounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = 0;
  (this->allLightBounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  (this->allLightBounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  (this->allLightBounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = 3.4028235e+38;
  (this->allLightBounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = 3.4028235e+38;
  *(undefined8 *)&(this->allLightBounds).pMin.super_Tuple3<pbrt::Point3,_float>.z =
       0xff7fffff7f7fffff;
  auVar9._8_4_ = 0xff7fffff;
  auVar9._0_8_ = 0xff7fffffff7fffff;
  auVar9._12_4_ = 0xff7fffff;
  uVar3 = vmovlps_avx(auVar9);
  (this->allLightBounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)uVar3;
  (this->allLightBounds).pMax.super_Tuple3<pbrt::Point3,_float>.z =
       (float)(int)((ulong)uVar3 >> 0x20);
  (this->nodes).alloc.memoryResource = alloc.memoryResource;
  (this->nodes).ptr = (LightBVHNode *)0x0;
  (this->nodes).nAlloc = 0;
  (this->nodes).nStored = 0;
  lightBounds.optionalValue._0_8_ = alloc.memoryResource;
  pstd::
  vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_>_>
  ::vector(&(this->lightToBitTrail).table,8,
           (polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_> *)
           &lightBounds);
  (this->lightToBitTrail).nStored = 0;
  bvhLights.
  super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bvhLights.
  super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bvhLights.
  super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (sVar7 != 0) {
    sVar8 = 0;
    do {
      light.
      super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
      .bits = (TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
               )first[sVar8].
                super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                .bits;
      LightHandle::Bounds(&lightBounds,&light);
      if (lightBounds.set == false) {
        pstd::vector<pbrt::LightHandle,_pstd::pmr::polymorphic_allocator<pbrt::LightHandle>_>::
        push_back(&this->infiniteLights,&light);
      }
      else if (0.0 < (float)lightBounds.optionalValue._24_4_) {
        local_68.first = (int)sVar8;
        local_68.second.w.super_Tuple3<pbrt::Vector3,_float>.z =
             (float)lightBounds.optionalValue._36_4_;
        local_68.second.cosTheta_o = (Float)lightBounds.optionalValue._40_4_;
        local_68.second.cosTheta_e = (Float)lightBounds.optionalValue._44_4_;
        local_68.second.twoSided = (bool)lightBounds.optionalValue._48_1_;
        local_68.second._49_3_ = lightBounds.optionalValue._49_3_;
        local_68.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x =
             (float)lightBounds.optionalValue._0_8_;
        local_68.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y =
             (float)((ulong)lightBounds.optionalValue._0_8_ >> 0x20);
        if (bvhLights.
            super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            bvhLights.
            super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::pair<int,pbrt::LightBounds>,std::allocator<std::pair<int,pbrt::LightBounds>>>
          ::_M_realloc_insert<std::pair<int,pbrt::LightBounds>>
                    ((vector<std::pair<int,pbrt::LightBounds>,std::allocator<std::pair<int,pbrt::LightBounds>>>
                      *)&bvhLights,
                     (iterator)
                     bvhLights.
                     super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_68);
        }
        else {
          *(ulong *)&((bvhLights.
                       super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->second).bounds.pMax.
                     super_Tuple3<pbrt::Point3,_float>.z =
               CONCAT44(lightBounds.optionalValue._24_4_,lightBounds.optionalValue._20_4_);
          ((bvhLights.
            super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->second).w.
          super_Tuple3<pbrt::Vector3,_float>.x = (float)lightBounds.optionalValue._28_4_;
          ((bvhLights.
            super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->second).w.
          super_Tuple3<pbrt::Vector3,_float>.y = (float)lightBounds.optionalValue._32_4_;
          *(undefined8 *)
           &((bvhLights.
              super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->second).w.
            super_Tuple3<pbrt::Vector3,_float>.z = lightBounds.optionalValue._36_8_;
          ((bvhLights.
            super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->second).cosTheta_e =
               (Float)lightBounds.optionalValue._44_4_;
          ((bvhLights.
            super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->second).twoSided =
               (bool)lightBounds.optionalValue._48_1_;
          *(undefined3 *)
           &((bvhLights.
              super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->second).field_0x31 =
               lightBounds.optionalValue._49_3_;
          (bvhLights.
           super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->first = local_68.first;
          ((bvhLights.
            super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->second).bounds.pMin.
          super_Tuple3<pbrt::Point3,_float>.x =
               local_68.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.x;
          ((bvhLights.
            super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->second).bounds.pMin.
          super_Tuple3<pbrt::Point3,_float>.y =
               local_68.second.bounds.pMin.super_Tuple3<pbrt::Point3,_float>.y;
          ((bvhLights.
            super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->second).bounds.pMin.
          super_Tuple3<pbrt::Point3,_float>.z = (float)lightBounds.optionalValue._8_4_;
          ((bvhLights.
            super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->second).bounds.pMax.
          super_Tuple3<pbrt::Point3,_float>.x = (float)lightBounds.optionalValue._12_4_;
          ((bvhLights.
            super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->second).bounds.pMax.
          super_Tuple3<pbrt::Point3,_float>.y = (float)lightBounds.optionalValue._16_4_;
          *(ulong *)&((bvhLights.
                       super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->second).bounds.pMax.
                     super_Tuple3<pbrt::Point3,_float>.z =
               CONCAT44(lightBounds.optionalValue._24_4_,lightBounds.optionalValue._20_4_);
          bvhLights.
          super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               bvhLights.
               super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        if (lightBounds.set == false) {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
        }
        auVar10._8_8_ = 0;
        auVar10._0_8_ = lightBounds.optionalValue._0_8_;
        uVar1 = (this->allLightBounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
        uVar4 = (this->allLightBounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
        auVar11._4_4_ = uVar4;
        auVar11._0_4_ = uVar1;
        auVar11._8_8_ = 0;
        auVar11 = vminps_avx(auVar10,auVar11);
        uVar2 = (this->allLightBounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
        uVar5 = (this->allLightBounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
        auVar12._4_4_ = uVar5;
        auVar12._0_4_ = uVar2;
        auVar12._8_8_ = 0;
        auVar6 = vminss_avx(ZEXT416((uint)lightBounds.optionalValue._8_4_),
                            ZEXT416((uint)(this->allLightBounds).pMin.
                                          super_Tuple3<pbrt::Point3,_float>.z));
        auVar13._4_4_ = lightBounds.optionalValue._16_4_;
        auVar13._0_4_ = lightBounds.optionalValue._12_4_;
        auVar13._8_8_ = 0;
        auVar9 = vmaxps_avx(auVar13,auVar12);
        auVar10 = vmaxss_avx(ZEXT416((uint)lightBounds.optionalValue._20_4_),
                             ZEXT416((uint)(this->allLightBounds).pMax.
                                           super_Tuple3<pbrt::Point3,_float>.z));
        uVar3 = vmovlps_avx(auVar11);
        (this->allLightBounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar3;
        (this->allLightBounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
             (float)(int)((ulong)uVar3 >> 0x20);
        (this->allLightBounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = auVar6._0_4_;
        uVar3 = vmovlps_avx(auVar9);
        (this->allLightBounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar3;
        (this->allLightBounds).pMax.super_Tuple3<pbrt::Point3,_float>.y =
             (float)(int)((ulong)uVar3 >> 0x20);
        (this->allLightBounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = auVar10._0_4_;
      }
      if (lightBounds.set == true) {
        lightBounds.set = false;
      }
      sVar8 = sVar8 + 1;
    } while (sVar7 != sVar8);
  }
  if (bvhLights.
      super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      bvhLights.
      super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    buildBVH((pair<int,_pbrt::LightBounds> *)&lightBounds,this,&bvhLights,0,
             (int)((ulong)((long)bvhLights.
                                 super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)bvhLights.
                                super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,0,0,
             alloc);
  }
  *(long *)(in_FS_OFFSET + -0x30) = *(long *)(in_FS_OFFSET + -0x30) + (this->nodes).nStored * 0x20;
  if (bvhLights.
      super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(bvhLights.
                    super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)bvhLights.
                          super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)bvhLights.
                          super__Vector_base<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

BVHLightSampler::BVHLightSampler(pstd::span<const LightHandle> lights, Allocator alloc)
    : lights(lights.begin(), lights.end(), alloc),
      infiniteLights(alloc),
      nodes(alloc),
      lightToBitTrail(alloc) {
    // Initialize _infiniteLights_ array and light BVH
    std::vector<std::pair<int, LightBounds>> bvhLights;
    for (size_t i = 0; i < lights.size(); ++i) {
        // Partition $i$th light into _infiniteLights_ or _bvhLights_
        LightHandle light = lights[i];
        pstd::optional<LightBounds> lightBounds = light.Bounds();
        if (!lightBounds)
            infiniteLights.push_back(light);
        else if (lightBounds->phi > 0) {
            bvhLights.push_back(std::make_pair(i, *lightBounds));
            allLightBounds = Union(allLightBounds, lightBounds->bounds);
        }
    }
    if (!bvhLights.empty())
        buildBVH(bvhLights, 0, bvhLights.size(), 0, 0, alloc);
    lightBVHBytes += nodes.size() * sizeof(LightBVHNode);
}